

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O0

char * ret_err(uint64_t ret,uint64_t err)

{
  size_t sVar1;
  uint64_t err_local;
  uint64_t ret_local;
  
  ret_err::r[0] = '\0';
  if (ret != 0) {
    sprintf(ret_err::r,", ret: %ld",ret);
  }
  if (err != 0) {
    sVar1 = strlen(ret_err::r);
    sprintf(ret_err::r + sVar1,", %serr: %ld%s",colors->err,err,colors->reset);
  }
  return ret_err::r;
}

Assistant:

static const char *ret_err(uint64_t ret, uint64_t err)
{
	static char r[100];
	r[0] = 0;

	if (ret)
		sprintf(r, ", ret: %" PRId64 "", ret);
	if (err)
		sprintf(r + strlen(r), ", %serr: %" PRId64 "%s", colors->err, err, colors->reset);

	return r;
}